

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rang.hpp
# Opt level: O2

bool rang::rang_implementation::supportsColor(void)

{
  int iVar1;
  anon_class_1_0_00000001 local_1;
  
  if (supportsColor()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&supportsColor()::result);
    if (iVar1 != 0) {
      supportsColor::result = supportsColor::anon_class_1_0_00000001::operator()(&local_1);
      __cxa_guard_release(&supportsColor()::result);
    }
  }
  return supportsColor::result;
}

Assistant:

inline bool supportsColor() noexcept
    {
#if defined(OS_LINUX) || defined(OS_MAC)

        static const bool result = [] {
            const char *Terms[]
              = { "ansi",    "color",  "console", "cygwin", "gnome",
                  "konsole", "kterm",  "linux",   "msys",   "putty",
                  "rxvt",    "screen", "vt100",   "xterm" };

            const char *env_p = std::getenv("TERM");
            if (env_p == nullptr) {
                return false;
            }
            return std::any_of(std::begin(Terms), std::end(Terms),
                               [&](const char *term) {
                                   return std::strstr(env_p, term) != nullptr;
                               });
        }();

#elif defined(OS_WIN)
        // All windows versions support colors through native console methods
        static constexpr bool result = true;
#endif
        return result;
    }